

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void tcu::opt::parseIntList(char *src,vector<int,_std::allocator<int>_> *dst)

{
  istream *piVar1;
  int intVal;
  string val;
  istringstream str;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&val,src,(allocator<char> *)&intVal);
  std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&val,_S_in);
  std::__cxx11::string::~string((string *)&val);
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&str,(string *)&val,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    intVal = 0;
    de::cmdline::parseType<int>(val._M_dataplus._M_p,&intVal);
    std::vector<int,_std::allocator<int>_>::push_back(dst,&intVal);
  }
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::istringstream::~istringstream((istringstream *)&str);
  return;
}

Assistant:

static void parseIntList (const char* src, std::vector<int>* dst)
{
	std::istringstream	str	(src);
	std::string			val;

	while (std::getline(str, val, ','))
	{
		int intVal = 0;
		de::cmdline::parseType(val.c_str(), &intVal);
		dst->push_back(intVal);
	}
}